

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::ColorEditOptionsPopup(float *col,ImGuiColorEditFlags flags)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  double dVar12;
  float fVar13;
  float fVar14;
  char buf [64];
  int iVar15;
  int local_8c;
  ImVec2 local_88;
  ImGuiContext *local_80;
  ImVec2 local_78 [9];
  
  if (((flags & 0x700000U) == 0 || (flags & 0x1800000U) == 0) &&
     (bVar5 = BeginPopup("context",0), bVar5)) {
    local_80 = GImGui;
    uVar7 = GImGui->ColorEditOptions;
    if ((flags & 0x700000U) == 0) {
      bVar5 = RadioButton("RGB",(bool)((byte)(uVar7 >> 0x14) & 1));
      uVar6 = (uVar7 & 0xff8fffff) + 0x100000;
      if (!bVar5) {
        uVar6 = uVar7;
      }
      bVar5 = RadioButton("HSV",(bool)((byte)(uVar6 >> 0x15) & 1));
      uVar7 = uVar7 & 0xff8fffff | 0x200000;
      if (!bVar5) {
        uVar7 = uVar6;
      }
      bVar5 = RadioButton("Hex",(bool)((byte)(uVar7 >> 0x16) & 1));
      if (bVar5) {
        uVar7 = uVar7 & 0xff8fffff | 0x400000;
      }
    }
    if ((flags & 0x1800000U) == 0) {
      if (((flags & 0x700000U) == 0) && (GImGui->CurrentWindow->SkipItems == false)) {
        SeparatorEx(((GImGui->CurrentWindow->DC).LayoutType == 0) + 5);
      }
      bVar5 = RadioButton("0..255",(bool)((byte)(uVar7 >> 0x17) & 1));
      uVar6 = (uVar7 & 0xfe7fffff) + 0x800000;
      if (!bVar5) {
        uVar6 = uVar7;
      }
      bVar5 = RadioButton("0.00..1.00",(bool)((byte)(uVar6 >> 0x18) & 1));
      uVar7 = uVar7 & 0xfe7fffff | 0x1000000;
      if (!bVar5) {
        uVar7 = uVar6;
      }
    }
    if (GImGui->CurrentWindow->SkipItems == false) {
      SeparatorEx(((GImGui->CurrentWindow->DC).LayoutType == 0) + 5);
    }
    local_78[0].x = -1.0;
    local_78[0].y = 0.0;
    bVar5 = ButtonEx("Copy as..",local_78,0);
    if (bVar5) {
      OpenPopup("Copy",0);
    }
    bVar5 = BeginPopup("Copy",0);
    if (bVar5) {
      fVar1 = *col;
      fVar2 = col[1];
      fVar10 = 1.0;
      if (fVar1 <= 1.0) {
        fVar10 = fVar1;
      }
      fVar13 = 1.0;
      if (fVar2 <= 1.0) {
        fVar13 = fVar2;
      }
      fVar3 = col[2];
      fVar14 = 1.0;
      if (fVar3 <= 1.0) {
        fVar14 = fVar3;
      }
      local_8c = 0xff;
      if ((flags & 2U) == 0) {
        fVar4 = col[3];
        fVar11 = 1.0;
        if (fVar4 <= 1.0) {
          fVar11 = fVar4;
        }
        local_8c = (int)((float)(~-(uint)(fVar4 < 0.0) & (uint)fVar11) * 255.0 + 0.5);
      }
      if ((flags & 2U) == 0) {
        dVar12 = (double)col[3];
      }
      else {
        dVar12 = 1.0;
      }
      uVar6 = (uint)((float)(~-(uint)(fVar1 < 0.0) & (uint)fVar10) * 255.0 + 0.5);
      uVar8 = (uint)((float)(~-(uint)(fVar2 < 0.0) & (uint)fVar13) * 255.0 + 0.5);
      uVar9 = (uint)((float)(~-(uint)(fVar3 < 0.0) & (uint)fVar14) * 255.0 + 0.5);
      ImFormatString((char *)local_78,0x40,"(%.3ff, %.3ff, %.3ff, %.3ff)",(double)fVar1,
                     (double)fVar2,(double)fVar3,dVar12);
      local_88.x = 0.0;
      local_88.y = 0.0;
      bVar5 = Selectable((char *)local_78,false,0,&local_88);
      if (bVar5) {
        SetClipboardText((char *)local_78);
      }
      iVar15 = local_8c;
      ImFormatString((char *)local_78,0x40,"(%d,%d,%d,%d)",(ulong)uVar6,(ulong)uVar8,(ulong)uVar9,
                     local_8c);
      local_88.x = 0.0;
      local_88.y = 0.0;
      bVar5 = Selectable((char *)local_78,false,0,&local_88);
      if (bVar5) {
        SetClipboardText((char *)local_78);
      }
      ImFormatString((char *)local_78,0x40,"#%02X%02X%02X",(ulong)uVar6,(ulong)uVar8,(ulong)uVar9,
                     iVar15);
      local_88.x = 0.0;
      local_88.y = 0.0;
      bVar5 = Selectable((char *)local_78,false,0,&local_88);
      if (bVar5) {
        SetClipboardText((char *)local_78);
      }
      if ((flags & 2U) == 0) {
        ImFormatString((char *)local_78,0x40,"#%02X%02X%02X%02X",(ulong)uVar6,(ulong)uVar8,
                       (ulong)uVar9,local_8c);
        local_88.x = 0.0;
        local_88.y = 0.0;
        bVar5 = Selectable((char *)local_78,false,0,&local_88);
        if (bVar5) {
          SetClipboardText((char *)local_78);
        }
      }
      EndPopup();
    }
    local_80->ColorEditOptions = uVar7;
    EndPopup();
  }
  return;
}

Assistant:

void ImGui::ColorEditOptionsPopup(const float* col, ImGuiColorEditFlags flags)
{
    bool allow_opt_inputs = !(flags & ImGuiColorEditFlags__DisplayMask);
    bool allow_opt_datatype = !(flags & ImGuiColorEditFlags__DataTypeMask);
    if ((!allow_opt_inputs && !allow_opt_datatype) || !BeginPopup("context"))
        return;
    ImGuiContext& g = *GImGui;
    ImGuiColorEditFlags opts = g.ColorEditOptions;
    if (allow_opt_inputs)
    {
        if (RadioButton("RGB", (opts & ImGuiColorEditFlags_DisplayRGB) != 0)) opts = (opts & ~ImGuiColorEditFlags__DisplayMask) | ImGuiColorEditFlags_DisplayRGB;
        if (RadioButton("HSV", (opts & ImGuiColorEditFlags_DisplayHSV) != 0)) opts = (opts & ~ImGuiColorEditFlags__DisplayMask) | ImGuiColorEditFlags_DisplayHSV;
        if (RadioButton("Hex", (opts & ImGuiColorEditFlags_DisplayHex) != 0)) opts = (opts & ~ImGuiColorEditFlags__DisplayMask) | ImGuiColorEditFlags_DisplayHex;
    }
    if (allow_opt_datatype)
    {
        if (allow_opt_inputs) Separator();
        if (RadioButton("0..255",     (opts & ImGuiColorEditFlags_Uint8) != 0)) opts = (opts & ~ImGuiColorEditFlags__DataTypeMask) | ImGuiColorEditFlags_Uint8;
        if (RadioButton("0.00..1.00", (opts & ImGuiColorEditFlags_Float) != 0)) opts = (opts & ~ImGuiColorEditFlags__DataTypeMask) | ImGuiColorEditFlags_Float;
    }

    if (allow_opt_inputs || allow_opt_datatype)
        Separator();
    if (Button("Copy as..", ImVec2(-1, 0)))
        OpenPopup("Copy");
    if (BeginPopup("Copy"))
    {
        int cr = IM_F32_TO_INT8_SAT(col[0]), cg = IM_F32_TO_INT8_SAT(col[1]), cb = IM_F32_TO_INT8_SAT(col[2]), ca = (flags & ImGuiColorEditFlags_NoAlpha) ? 255 : IM_F32_TO_INT8_SAT(col[3]);
        char buf[64];
        ImFormatString(buf, IM_ARRAYSIZE(buf), "(%.3ff, %.3ff, %.3ff, %.3ff)", col[0], col[1], col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : col[3]);
        if (Selectable(buf))
            SetClipboardText(buf);
        ImFormatString(buf, IM_ARRAYSIZE(buf), "(%d,%d,%d,%d)", cr, cg, cb, ca);
        if (Selectable(buf))
            SetClipboardText(buf);
        ImFormatString(buf, IM_ARRAYSIZE(buf), "#%02X%02X%02X", cr, cg, cb);
        if (Selectable(buf))
            SetClipboardText(buf);
        if (!(flags & ImGuiColorEditFlags_NoAlpha))
        {
            ImFormatString(buf, IM_ARRAYSIZE(buf), "#%02X%02X%02X%02X", cr, cg, cb, ca);
            if (Selectable(buf))
                SetClipboardText(buf);
        }
        EndPopup();
    }

    g.ColorEditOptions = opts;
    EndPopup();
}